

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy_testcase_api_tests.cpp
# Opt level: O2

void __thiscall
iu_EventListenerTest_x_iutest_x_FlagCheck_Test::Body
          (iu_EventListenerTest_x_iutest_x_FlagCheck_Test *this)

{
  char *in_R9;
  AssertionResult iutest_ar;
  string local_210;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  byte local_1d0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  local_1d0 = listener->called_OnTestCaseStart;
  local_1e8 = 0;
  local_1e0[0] = 0;
  local_1f0 = local_1e0;
  if ((bool)local_1d0 == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&local_1f0,
               (AssertionResult *)"listener->called_OnTestCaseStart","false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
               ,0xc2,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    local_1e8 = 0;
    local_1d0 = listener->called_OnTestCaseEnd ^ 1;
    local_1e0[0] = 0;
    local_1f0 = local_1e0;
    if (listener->called_OnTestCaseEnd == false) goto LAB_00121720;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&local_1f0,(AssertionResult *)"listener->called_OnTestCaseEnd"
               ,"true","false",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
               ,0xc3,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_210);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_00121720:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

IUTEST(EventListenerTest, FlagCheck)
{
    IUTEST_ASSERT_TRUE( listener->called_OnTestCaseStart );
    IUTEST_ASSERT_FALSE( listener->called_OnTestCaseEnd );
}